

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O2

uint64_t get_np_dist(uint64_t *np,BiomeTree *bt,int idx)

{
  uint64_t uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  uVar1 = 0;
  for (lVar2 = 0; lVar2 != 0x30; lVar2 = lVar2 + 8) {
    uVar4 = (ulong)(((uint)(bt->nodes[idx] >> ((byte)lVar2 & 0x3f)) & 0xff) * 2);
    lVar3 = *(long *)((long)np + lVar2) - (long)bt->param[uVar4 + 1];
    if ((lVar3 < 1) && (lVar3 = (long)bt->param[uVar4] - *(long *)((long)np + lVar2), lVar3 < 1)) {
      lVar3 = 0;
    }
    uVar1 = uVar1 + lVar3 * lVar3;
  }
  return uVar1;
}

Assistant:

static
uint64_t get_np_dist(const uint64_t np[6], const BiomeTree *bt, int idx)
{
    uint64_t ds = 0, node = bt->nodes[idx];
    uint64_t a, b, d;
    uint32_t i;

    for (i = 0; i < 6; i++)
    {
        idx = (node >> 8*i) & 0xFF;
        a = np[i] - bt->param[2*idx + 1];
        b = bt->param[2*idx + 0] - np[i];
        d = (int64_t)a > 0 ? a : (int64_t)b > 0 ? b : 0;
        d = d * d;
        ds += d;
    }
    return ds;
}